

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::utlru_cache(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
              *this,milliseconds ttl,size_t capacity,float max_load_factor)

{
  size_type sVar1;
  iterator iVar2;
  iterator __last;
  utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  *this_00;
  allocator<unsigned_long> local_35 [16];
  allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>
  local_25;
  float local_24;
  size_t sStack_20;
  float max_load_factor_local;
  size_t capacity_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  milliseconds ttl_local;
  
  local_24 = max_load_factor;
  sStack_20 = capacity;
  capacity_local = (size_t)this;
  this_local = (utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)ttl.__r;
  mutex<(cappuccino::thread_safe)0,_std::mutex>::mutex
            ((mutex<(cappuccino::thread_safe)0,_std::mutex> *)this);
  sVar1 = sStack_20;
  *(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
    **)(this + 0x28) = this_local;
  *(undefined8 *)(this + 0x30) = 0;
  std::
  allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>
  ::allocator(&local_25);
  std::
  vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
  ::vector((vector<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element,_std::allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>_>
            *)(this + 0x38),sVar1,&local_25);
  std::
  allocator<cappuccino::utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>::element>
  ::~allocator(&local_25);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)(this + 0x50));
  sVar1 = sStack_20;
  std::allocator<unsigned_long>::allocator(local_35);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),sVar1,local_35);
  std::allocator<unsigned_long>::~allocator(local_35);
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0));
  std::_List_iterator<unsigned_long>::_List_iterator((_List_iterator<unsigned_long> *)(this + 0xb8))
  ;
  this_00 = this + 0x88;
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  __last = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::iota<std::_List_iterator<unsigned_long>,int>
            ((_List_iterator<unsigned_long>)iVar2._M_node,
             (_List_iterator<unsigned_long>)__last._M_node,0);
  iVar2 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  *(_List_node_base **)(this + 0xb8) = iVar2._M_node;
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::max_load_factor((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                     *)(this + 0x50),local_24);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::reserve((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             *)(this + 0x50),sStack_20);
  return;
}

Assistant:

utlru_cache(std::chrono::milliseconds ttl, size_t capacity, float max_load_factor = 1.0f)
        : m_ttl(ttl),
          m_elements(capacity),
          m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }